

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-ring.c
# Opt level: O0

size_t lws_ring_consume(lws_ring *ring,uint32_t *tail,void *dest,size_t max_count)

{
  int iVar1;
  size_t sVar2;
  uint local_4c;
  int n;
  int m;
  uint32_t fake_tail;
  void *orig_tail;
  uint8_t *odest;
  size_t max_count_local;
  void *dest_local;
  uint32_t *tail_local;
  lws_ring *ring_local;
  
  dest_local = tail;
  if (tail == (uint32_t *)0x0) {
    n = ring->oldest_tail;
    dest_local = &n;
  }
  _m = tail;
  orig_tail = dest;
  odest = (uint8_t *)max_count;
  max_count_local = (size_t)dest;
  tail_local = (uint32_t *)ring;
  sVar2 = lws_ring_get_count_waiting_elements(ring,(uint32_t *)dest_local);
  local_4c = (int)sVar2 * tail_local[5];
  if ((long)odest * (ulong)tail_local[5] < (ulong)(long)(int)local_4c) {
    local_4c = (int)odest * tail_local[5];
  }
  if (max_count_local == 0) {
    *(uint *)dest_local = (*dest_local + local_4c) % tail_local[4];
    if (_m == (uint32_t *)0x0) {
      lws_ring_update_oldest_tail((lws_ring *)tail_local,*dest_local);
    }
    ring_local = (lws_ring *)((ulong)local_4c / (ulong)tail_local[5]);
  }
  else {
    if (tail_local[4] < *dest_local + local_4c) {
      iVar1 = tail_local[4] - *dest_local;
      memcpy((void *)max_count_local,(void *)(*(long *)tail_local + (ulong)*dest_local),(long)iVar1)
      ;
      *(undefined4 *)dest_local = 0;
      max_count_local = max_count_local + (long)iVar1;
      local_4c = local_4c - iVar1;
    }
    memcpy((void *)max_count_local,(void *)(*(long *)tail_local + (ulong)*dest_local),
           (long)(int)local_4c);
    *(uint *)dest_local = (*dest_local + local_4c) % tail_local[4];
    if (_m == (uint32_t *)0x0) {
      lws_ring_update_oldest_tail((lws_ring *)tail_local,*dest_local);
    }
    ring_local = (lws_ring *)
                 (((max_count_local + (long)(int)local_4c) - (long)orig_tail & 0xffffffff) /
                 (ulong)tail_local[5]);
  }
  return (size_t)ring_local;
}

Assistant:

size_t
lws_ring_consume(struct lws_ring *ring, uint32_t *tail, void *dest,
		 size_t max_count)
{
	uint8_t *odest = dest;
	void *orig_tail = tail;
	uint32_t fake_tail;
	int m, n;

	if (!tail) {
		fake_tail = ring->oldest_tail;
		tail = &fake_tail;
	}

	/* n is how many bytes the whole fifo has for us */
	n = (int)(lws_ring_get_count_waiting_elements(ring, tail) *
							ring->element_len);

	/* restrict n to how much we want to insert */
	if ((size_t)n > max_count * ring->element_len)
		n = (int)(max_count * ring->element_len);

	if (!dest) {
		*tail = ((*tail) + (unsigned int)n) % ring->buflen;
		if (!orig_tail) /* single tail */
			lws_ring_update_oldest_tail(ring, *tail);

		return (unsigned int)n / ring->element_len;
	}
	if (*tail + (unsigned int)n > ring->buflen) {

		/*
		 * He does wrap.  The first memcpy should take us up to
		 * the end of the buffer
		 */

		m = (int32_t)(ring->buflen - *tail);
		memcpy(dest, ((uint8_t *)ring->buf) + *tail, (size_t)m);
		/* we know it will wrap exactly back to zero */
		*tail = 0;

		/* adapt the second memcpy for what we already did */

		dest = ((uint8_t *)dest) + m;
		n -= m;
	}

	memcpy(dest, ((uint8_t *)ring->buf) + *tail, (size_t)n);

	*tail = ((*tail) + (unsigned int)n) % ring->buflen;
	if (!orig_tail) /* single tail */
		lws_ring_update_oldest_tail(ring, *tail);

	return (unsigned int)(((uint8_t *)dest + n) - odest) / (unsigned int)ring->element_len;
}